

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawIdx_resizeT(ImVector_ImDrawIdx *self,int new_size,ImDrawIdx v)

{
  ImDrawIdx local_16;
  int local_14;
  ImDrawIdx v_local;
  ImVector_ImDrawIdx *pIStack_10;
  int new_size_local;
  ImVector_ImDrawIdx *self_local;
  
  local_16 = v;
  local_14 = new_size;
  pIStack_10 = self;
  ImVector<unsigned_short>::resize(self,new_size,&local_16);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawIdx_resizeT(ImVector_ImDrawIdx* self,int new_size,const ImDrawIdx v)
{
    return self->resize(new_size,v);
}